

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_states.hpp
# Opt level: O2

void __thiscall
duckdb::MultiFileReaderData::MultiFileReaderData
          (MultiFileReaderData *this,OpenFileInfo *file_to_be_opened)

{
  (this->closed_reader).internal.
  super___weak_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->closed_reader).internal.
  super___weak_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->reader).internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->reader).internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->file_state = UNOPENED;
  make_uniq<std::mutex>();
  (this->expressions).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->expressions).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->constant_map).constant_map.
  super_vector<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>.
  super__Vector_base<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->expressions).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->constant_map).constant_map.
  super_vector<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>.
  super__Vector_base<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->constant_map).constant_map.
  super_vector<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>.
  super__Vector_base<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->union_data).internal.super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->union_data).internal.super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  OpenFileInfo::OpenFileInfo(&this->file_to_be_opened,file_to_be_opened);
  return;
}

Assistant:

explicit MultiFileReaderData(const OpenFileInfo &file_to_be_opened)
	    : reader(nullptr), file_state(MultiFileFileState::UNOPENED), file_mutex(make_uniq<mutex>()),
	      file_to_be_opened(file_to_be_opened) {
	}